

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

ElementDocument * __thiscall Rml::Element::GetOwnerDocument(Element *this)

{
  code *pcVar1;
  bool bVar2;
  ElementDocument *pEVar3;
  Element *this_local;
  
  if ((((this->parent != (Element *)0x0) && (this->owner_document == (ElementDocument *)0x0)) &&
      (pEVar3 = GetOwnerDocument(this->parent), pEVar3 != (ElementDocument *)0x0)) &&
     (bVar2 = Assert("RMLUI_ASSERT(!parent->GetOwnerDocument())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x411), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return this->owner_document;
}

Assistant:

ElementDocument* Element::GetOwnerDocument() const
{
#ifdef RMLUI_DEBUG
	if (parent && !owner_document)
	{
		// Since we have a parent but no owner_document, then we must be a 'loose' element -- that is, constructed
		// outside of a document and not attached to a child of any element in the hierarchy of a document.
		// This check ensures that we didn't just forget to set the owner document.
		RMLUI_ASSERT(!parent->GetOwnerDocument());
	}
#endif

	return owner_document;
}